

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCase::TestCase(TestCase *this,ITestInvoker *testCase,TestCaseInfo *info)

{
  TestCaseInfo *info_local;
  ITestInvoker *testCase_local;
  TestCase *this_local;
  
  TestCaseInfo::TestCaseInfo(&this->super_TestCaseInfo,info);
  std::shared_ptr<Catch::ITestInvoker>::shared_ptr<Catch::ITestInvoker,void>(&this->test,testCase);
  return;
}

Assistant:

TestCase::TestCase( ITestInvoker* testCase, TestCaseInfo&& info ) : TestCaseInfo( std::move(info) ), test( testCase ) {}